

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O3

void gray_render_cubic(PWorker worker,QT_FT_Vector *control1,QT_FT_Vector *control2,QT_FT_Vector *to
                      )

{
  long lVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int in_R8D;
  ulong uVar11;
  int in_R9D;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint *puVar15;
  uint *puVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  int in_stack_00000008;
  uint local_1c8;
  uint local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  uint local_1b0;
  uint local_1ac;
  undefined1 local_1a8 [368];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_1a8,0xaa,0x168);
  local_1c8 = in_R9D << 2;
  uVar19 = (ulong)local_1c8;
  uVar20 = in_stack_00000008 << 2;
  local_1c4 = uVar20;
  local_1c0 = (int)to << 2;
  local_1bc = in_R8D << 2;
  local_1b8 = (int)control1 << 2;
  local_1b4 = (int)control2 << 2;
  uVar2 = (uint)worker->x;
  local_1b0 = uVar2;
  uVar4 = (uint)worker->y;
  local_1ac = uVar4;
  lVar3 = worker->max_ey;
  iVar17 = (in_R8D << 2) >> 8;
  iVar8 = local_1b4 >> 8;
  if ((((((int)uVar20 >> 8 < lVar3) || (iVar17 < lVar3)) || (iVar8 < lVar3)) ||
      ((int)uVar4 >> 8 < lVar3)) &&
     (((lVar3 = worker->min_ey, lVar3 <= (int)uVar20 >> 8 || (lVar3 <= iVar17)) ||
      ((lVar3 <= iVar8 || (lVar3 <= (int)uVar4 >> 8)))))) {
    puVar15 = &local_1c8;
    do {
      iVar17 = (int)uVar19;
      uVar12 = (ulong)(int)(uVar2 - iVar17);
      uVar11 = (ulong)(int)(uVar4 - uVar20);
      uVar19 = -uVar12;
      if (0 < (long)uVar12) {
        uVar19 = uVar12;
      }
      uVar10 = -uVar11;
      if (0 < (long)uVar11) {
        uVar10 = uVar11;
      }
      if (uVar10 < uVar19) {
        uVar10 = uVar10 * 3 >> 3;
      }
      else {
        uVar19 = uVar19 * 3 >> 3;
      }
      lVar6 = (long)iVar17;
      lVar3 = (long)(int)uVar20;
      if (uVar10 + uVar19 < 0x800000) {
        uVar10 = (uVar10 + uVar19) * 0x2a;
        uVar14 = puVar15[2];
        uVar9 = puVar15[3];
        lVar7 = (long)(int)(uVar14 - iVar17);
        lVar13 = (long)(int)(uVar9 - uVar20);
        uVar21 = lVar7 * uVar11 - lVar13 * uVar12;
        uVar19 = -uVar21;
        if (0 < (long)uVar21) {
          uVar19 = uVar21;
        }
        if (uVar10 < uVar19) goto LAB_00391653;
        lVar5 = (int)puVar15[4] - lVar6;
        lVar1 = (int)puVar15[5] - lVar3;
        uVar21 = lVar5 * uVar11 - lVar1 * uVar12;
        uVar19 = -uVar21;
        if (0 < (long)uVar21) {
          uVar19 = uVar21;
        }
        if (((uVar10 < uVar19) ||
            (lVar7 = (lVar7 - uVar12) * lVar7, lVar13 = (lVar13 - uVar11) * lVar13,
            lVar18 = lVar13 + lVar7, lVar18 != 0 && SCARRY8(lVar13,lVar7) == lVar18 < 0)) ||
           (lVar5 = (lVar5 - uVar12) * lVar5, lVar1 = (lVar1 - uVar11) * lVar1,
           lVar13 = lVar1 + lVar5, lVar13 != 0 && SCARRY8(lVar1,lVar5) == lVar13 < 0))
        goto LAB_00391653;
        gray_render_line(worker,lVar6,lVar3);
        if (puVar15 == &local_1c8) goto LAB_00391534;
        uVar19 = (ulong)puVar15[-6];
        puVar16 = puVar15 + -6;
      }
      else {
        uVar14 = puVar15[2];
        uVar9 = puVar15[3];
LAB_00391653:
        puVar16 = puVar15 + 6;
        puVar15[0xc] = uVar2;
        lVar13 = (lVar6 + (int)uVar14) / 2;
        puVar15[2] = (uint)lVar13;
        lVar7 = ((long)(int)uVar2 + (long)(int)puVar15[4]) / 2;
        puVar15[10] = (uint)lVar7;
        lVar6 = ((long)(int)puVar15[4] + (long)(int)uVar14) / 2;
        lVar13 = (lVar13 + lVar6) / 2;
        puVar15[4] = (uint)lVar13;
        lVar6 = (lVar6 + lVar7) / 2;
        puVar15[8] = (uint)lVar6;
        lVar6 = lVar6 + lVar13;
        uVar19 = (ulong)(lVar6 - (lVar6 >> 0x3f)) >> 1;
        puVar15[6] = (uint)uVar19;
        puVar15[0xd] = uVar4;
        lVar6 = (lVar3 + (int)uVar9) / 2;
        puVar15[3] = (uint)lVar6;
        lVar13 = ((long)(int)uVar4 + (long)(int)puVar15[5]) / 2;
        puVar15[0xb] = (uint)lVar13;
        lVar3 = ((long)(int)puVar15[5] + (long)(int)uVar9) / 2;
        lVar6 = (lVar6 + lVar3) / 2;
        puVar15[5] = (uint)lVar6;
        lVar3 = (lVar3 + lVar13) / 2;
        puVar15[9] = (uint)lVar3;
        lVar3 = lVar3 + lVar6;
        puVar15[7] = (uint)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 1);
      }
      uVar20 = puVar16[1];
      uVar2 = puVar16[6];
      uVar4 = puVar16[7];
      puVar15 = puVar16;
    } while( true );
  }
  worker->x = (long)(int)local_1c8;
  worker->y = (long)(int)uVar20;
LAB_00391534:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const QT_FT_Vector*  control1,
                              const QT_FT_Vector*  control2,
                              const QT_FT_Vector*  to )
  {
    QT_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    QT_FT_Vector*  arc = bez_stack;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = QT_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = QT_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = QT_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      gray_split_cubic( arc );
      arc += 3;
    }
  }